

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::Tracer_testTracerSimpleChild_Test::TestBody(Tracer_testTracerSimpleChild_Test *this)

{
  element_type *peVar1;
  string_view operation_name;
  string_view operation_name_00;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_> option_list;
  AssertHelper aAStack_88 [8];
  long *local_80;
  long *local_78;
  AssertHelper local_70 [8];
  AssertionResult local_68;
  undefined8 local_58;
  AssertionResult gtest_ar_;
  shared_ptr<jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)&tracer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68.message_);
  operation_name.length_ = (size_t)"test-simple-root";
  operation_name.data_ =
       (char *)tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  opentracing::v3::Tracer::StartSpan
            ((Tracer *)&local_78,operation_name,
             (initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>)
             ZEXT816(0x10));
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = local_78 != (long *)0x0;
  if (local_78 == (long *)0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,&gtest_ar_.success_,"spanRoot","false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x1f8,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(aAStack_88);
    std::__cxx11::string::~string((string *)&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    peVar1 = tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58 = (**(code **)(*local_78 + 0x50))();
    local_68._0_8_ = &PTR__StartSpanOption_0021f2b8;
    local_68.message_.ptr_._0_4_ = 1;
    operation_name_00.length_ = (size_t)"test-simple-child";
    operation_name_00.data_ = (char *)peVar1;
    option_list._M_len = (size_type)&gtest_ar_;
    option_list._M_array = (iterator)0x11;
    gtest_ar_._0_8_ = &local_68;
    opentracing::v3::Tracer::StartSpan((Tracer *)&local_80,operation_name_00,option_list);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = local_80 != (long *)0x0;
    if (local_80 != (long *)0x0) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      if (local_78 != (long *)0x0) {
        (**(code **)(*local_78 + 8))();
      }
      (**(code **)(*(long *)tracer.
                            super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 0x58))();
      goto LAB_001ab2e2;
    }
    testing::Message::Message((Message *)aAStack_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,&gtest_ar_.success_,"spanChild","false");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x1fb,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)aAStack_88);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)aAStack_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
  }
  if (local_78 != (long *)0x0) {
    (**(code **)(*local_78 + 8))();
  }
LAB_001ab2e2:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&handle.
              super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

TEST(Tracer, testTracerSimpleChild)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer = std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    {
        auto spanRoot = tracer->StartSpan("test-simple-root");
        ASSERT_TRUE(spanRoot);
        auto spanChild = tracer->StartSpan("test-simple-child",
            { opentracing::ChildOf(&spanRoot->context()) });
        ASSERT_TRUE(spanChild);
    }
    tracer->Close();
}